

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O1

void __thiscall DACSThinker::Serialize(DACSThinker *this,FSerializer *arc)

{
  ScriptMap *this_00;
  DLevelScript *pDVar1;
  bool bVar2;
  hash_t hVar3;
  uint uVar4;
  Node *pNVar5;
  SavingRunningscript *pSVar6;
  IPair *pIVar7;
  uint uVar8;
  ulong uVar9;
  IPair *unaff_R13;
  DObject *v;
  SavingRunningscript local_40;
  
  DObject::Serialize((DObject *)this,arc);
  local_40._0_8_ = this->Scripts;
  ::Serialize(arc,"scripts",(DObject **)&local_40,(DObject **)0x0,(bool *)0x0);
  this->Scripts = (DLevelScript *)local_40._0_8_;
  local_40._0_8_ = this->LastScript;
  pSVar6 = (SavingRunningscript *)0x0;
  ::Serialize(arc,"lastscript",(DObject **)&local_40,(DObject **)0x0,(bool *)0x0);
  this->LastScript = (DLevelScript *)local_40._0_8_;
  this_00 = &this->RunningScripts;
  if (arc->w == (FWriter *)0x0) {
    M_Free(this_00->Nodes);
    this_00->Nodes = (Node *)0x0;
    (this->RunningScripts).LastFree = (Node *)0x0;
    (this->RunningScripts).Size = 0;
    (this->RunningScripts).NumUsed = 0;
    TMap<int,_DLevelScript_*,_THashTraits<int>,_TValueTraits<DLevelScript_*>_>::SetNodeVector
              (this_00,1);
    bVar2 = FSerializer::BeginArray(arc,"runningscripts");
    if (bVar2) {
      uVar4 = FSerializer::ArraySize(arc);
      if (uVar4 != 0) {
        do {
          ::Serialize(arc,(char *)0x0,&local_40,pSVar6);
          pDVar1 = local_40.lscript;
          pNVar5 = TMap<int,_DLevelScript_*,_THashTraits<int>,_TValueTraits<DLevelScript_*>_>::
                   GetNode(this_00,local_40.scriptnum);
          (pNVar5->Pair).Value = pDVar1;
          uVar4 = uVar4 - 1;
        } while (uVar4 != 0);
      }
LAB_003bad93:
      FSerializer::EndArray(arc);
    }
  }
  else {
    hVar3 = TMap<int,_DLevelScript_*,_THashTraits<int>,_TValueTraits<DLevelScript_*>_>::CountUsed
                      (this_00);
    if (hVar3 != 0) {
      FSerializer::BeginArray(arc,"runningscripts");
      uVar9 = 0;
      do {
        uVar4 = (this->RunningScripts).Size;
        uVar8 = (uint)uVar9;
        if (uVar8 < uVar4) {
          pNVar5 = this_00->Nodes + uVar9;
          do {
            pIVar7 = &pNVar5->Pair;
            uVar8 = uVar8 + 1;
            uVar9 = (ulong)uVar8;
            if (*(long *)((long)(pIVar7 + -1) + 8) != 1) {
              pSVar6 = (SavingRunningscript *)CONCAT71((uint7)(uint3)(-uVar4 >> 8),1);
              unaff_R13 = pIVar7;
              goto LAB_003bacf0;
            }
            pNVar5 = (Node *)(pIVar7 + 1);
          } while (uVar8 != uVar4);
          pSVar6 = (SavingRunningscript *)0x0;
          uVar9 = (ulong)uVar4;
        }
        else {
          pSVar6 = (SavingRunningscript *)0x0;
        }
LAB_003bacf0:
        if ((char)pSVar6 == '\0') goto LAB_003bad93;
        if (unaff_R13->Value == (DLevelScript *)0x0) {
          __assert_fail("pair->Value != nullptr",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_acs.cpp"
                        ,0xb74,"virtual void DACSThinker::Serialize(FSerializer &)");
        }
        local_40.scriptnum = unaff_R13->Key;
        local_40.lscript = unaff_R13->Value;
        ::Serialize(arc,(char *)0x0,&local_40,pSVar6);
      } while( true );
    }
  }
  return;
}

Assistant:

void DACSThinker::Serialize(FSerializer &arc)
{
	Super::Serialize(arc);
	arc("scripts", Scripts)
		("lastscript", LastScript);

	if (arc.isWriting())
	{
		if (RunningScripts.CountUsed())
		{
			ScriptMap::Iterator it(RunningScripts);
			ScriptMap::Pair *pair;

			arc.BeginArray("runningscripts");
			while (it.NextPair(pair))
			{
				assert(pair->Value != nullptr);
				SavingRunningscript srs = { pair->Key, pair->Value };
				arc(nullptr, srs);
			}
			arc.EndArray();
		}
	}
	else // Loading
	{
		DLevelScript *script = nullptr;
		RunningScripts.Clear();
		if (arc.BeginArray("runningscripts"))
		{
			auto cnt = arc.ArraySize();
			for (unsigned i = 0; i < cnt; i++)
			{
				SavingRunningscript srs;
				arc(nullptr, srs);
				RunningScripts[srs.scriptnum] = srs.lscript;
			}
			arc.EndArray();
		}
	}
}